

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

void __thiscall
mocker::anon_unknown_6::FindPureFunctions::operator()(FindPureFunctions *this,UnaryExpr *node)

{
  shared_ptr<mocker::ast::ASTNode> local_28;
  UnaryExpr *local_18;
  UnaryExpr *node_local;
  FindPureFunctions *this_local;
  
  local_18 = node;
  node_local = (UnaryExpr *)this;
  std::shared_ptr<mocker::ast::ASTNode>::shared_ptr<mocker::ast::Expression,void>
            (&local_28,&node->operand);
  visit(this,&local_28);
  std::shared_ptr<mocker::ast::ASTNode>::~shared_ptr(&local_28);
  return;
}

Assistant:

void operator()(const ast::UnaryExpr &node) const override {
    visit(node.operand);
  }